

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O0

void pnga_update1_ghosts(Integer g_a)

{
  short sVar1;
  short sVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Integer IVar6;
  logical lVar7;
  void *__ptr;
  void *__ptr_00;
  long lVar8;
  size_t sVar9;
  Integer IVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long in_RDI;
  int _d_15;
  int _i_21;
  int _ndim_19;
  int _i_20;
  int _itmp_7;
  int _offset_7;
  int _ndim_18;
  int _i_19;
  int _index_15 [7];
  int _ndim_17;
  int _i_18;
  int _itmp_6;
  int _ndim_16;
  int _i_17;
  int _index_14 [7];
  int _ndim_15;
  int _i_16;
  Integer _dimpos_7;
  Integer _dimstart_7;
  Integer _dim_7;
  Integer _index_13;
  Integer _d_14;
  Integer _nb_7;
  Integer _loc_7;
  Integer _dimpos_6;
  Integer _dimstart_6;
  Integer _dim_6;
  Integer _index_12;
  Integer _d_13;
  Integer _nb_6;
  Integer _loc_6;
  Integer _hi_3 [7];
  Integer _lo_3 [7];
  Integer _offset_6;
  Integer _last_3;
  Integer _factor_3;
  Integer _d_12;
  int _ndim_14;
  int _i_15;
  int _itmp_5;
  int _offset_5;
  int _ndim_13;
  int _i_14;
  int _index_11 [7];
  int _ndim_12;
  int _i_13;
  int _itmp_4;
  int _ndim_11;
  int _i_12;
  int _index_10 [7];
  int _ndim_10;
  int _i_11;
  Integer _dimpos_5;
  Integer _dimstart_5;
  Integer _dim_5;
  Integer _index_9;
  Integer _d_11;
  Integer _nb_5;
  Integer _loc_5;
  Integer _dimpos_4;
  Integer _dimstart_4;
  Integer _dim_4;
  Integer _index_8;
  Integer _d_10;
  Integer _nb_4;
  Integer _loc_4;
  Integer _hi_2 [7];
  Integer _lo_2 [7];
  Integer _offset_4;
  Integer _last_2;
  Integer _factor_2;
  Integer _d_9;
  char err_string_1 [256];
  char *str_1;
  int _l_1;
  int _d_8;
  int _d_7;
  int _i_10;
  int _ndim_9;
  int _i_9;
  int _itmp_3;
  int _offset_3;
  int _ndim_8;
  int _i_8;
  int _index_7 [7];
  int _ndim_7;
  int _i_7;
  int _itmp_2;
  int _ndim_6;
  int _i_6;
  int _index_6 [7];
  int _ndim_5;
  int _i_5;
  Integer _dimpos_3;
  Integer _dimstart_3;
  Integer _dim_3;
  Integer _index_5;
  Integer _d_6;
  Integer _nb_3;
  Integer _loc_3;
  Integer _dimpos_2;
  Integer _dimstart_2;
  Integer _dim_2;
  Integer _index_4;
  Integer _d_5;
  Integer _nb_2;
  Integer _loc_2;
  Integer _hi_1 [7];
  Integer _lo_1 [7];
  Integer _offset_2;
  Integer _last_1;
  Integer _factor_1;
  Integer _d_4;
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset_1;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_3;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d_2;
  Integer _nb;
  Integer _loc;
  Integer _hi [7];
  Integer _lo [7];
  Integer _offset;
  Integer _last;
  Integer _factor;
  Integer _d_1;
  char err_string [256];
  char *str;
  int _l;
  int _d;
  Integer *_ga_proclist;
  Integer *_ga_map;
  Integer p_handle;
  Integer me;
  logical hasData;
  char *ptr_rem;
  char *ptr_loc;
  int count [7];
  int stride_rem [7];
  int stride_loc [7];
  int corner_flag;
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer phi_rem [7];
  Integer plo_rem [7];
  Integer shi_rem [7];
  Integer slo_rem [7];
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer hi_rem [7];
  Integer lo_rem [7];
  Integer plo_loc [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer imax;
  Integer dims [7];
  Integer width [7];
  Integer increment [7];
  Integer slice;
  Integer offset;
  Integer nwidth;
  Integer ndim;
  Integer size;
  Integer proc_rem;
  Integer handle;
  Integer np;
  Integer i;
  Integer inx;
  Integer ipx;
  Integer idx;
  int in_stack_fffffffffffff29c;
  int *in_stack_fffffffffffff2a0;
  int *in_stack_fffffffffffff2a8;
  void *in_stack_fffffffffffff2b0;
  int in_stack_fffffffffffff2b8;
  int in_stack_fffffffffffff2bc;
  int in_stack_fffffffffffff2c0;
  int in_stack_fffffffffffff2c4;
  int local_d38;
  int local_d34;
  int in_stack_fffffffffffff2d0;
  int local_d2c;
  int local_d28 [7];
  int local_d0c;
  int local_d08;
  int local_d04;
  int local_d00;
  int local_cfc;
  int local_cf8 [10];
  int local_cd0;
  int local_ccc;
  long local_cc8;
  long local_cc0;
  long local_cb8;
  long local_cb0;
  long local_ca8;
  long local_ca0;
  long local_c98;
  long local_c90;
  long local_c88;
  long local_c80;
  long local_c78;
  long local_c70;
  long local_c68;
  long local_c60;
  long local_c58 [8];
  long local_c18 [7];
  long local_be0;
  long local_bd8;
  long local_bd0;
  long in_stack_fffffffffffff438;
  int in_stack_fffffffffffff440;
  int in_stack_fffffffffffff444;
  int local_bb8;
  int local_bb4;
  int local_bac;
  int local_ba8 [7];
  int local_b8c;
  int local_b88;
  int local_b84;
  int local_b80;
  int local_b7c;
  int local_b78 [2];
  Integer in_stack_fffffffffffff490;
  int local_b4c;
  long local_b40;
  long local_b30;
  long local_b28;
  long local_b20;
  long local_b08;
  long local_af8;
  long local_af0;
  long local_ae8;
  long local_ad8 [8];
  long local_a98 [8];
  Integer *in_stack_fffffffffffff5a8;
  long lVar14;
  Integer *in_stack_fffffffffffff5b0;
  long in_stack_fffffffffffff5b8;
  long in_stack_fffffffffffff5c0;
  char local_a38 [256];
  char *local_938;
  int local_930;
  int local_92c;
  int local_928;
  int local_924;
  int local_920;
  int local_91c;
  int local_918;
  int local_914;
  int local_910;
  int local_90c;
  int local_908 [7];
  int local_8ec;
  int local_8e8;
  int local_8e4;
  int local_8e0;
  int local_8dc;
  int local_8d8 [10];
  int local_8b0;
  int local_8ac;
  long local_8a8;
  long local_8a0;
  long local_898;
  long local_890;
  long local_888;
  long local_880;
  long local_878;
  long local_870;
  long local_868;
  long local_860;
  long local_858;
  long local_850;
  long local_848;
  long local_840;
  long local_838 [8];
  long local_7f8 [7];
  long local_7c0;
  long local_7b8;
  long local_7b0;
  long local_7a8;
  int local_7a0;
  int local_79c;
  int local_798;
  int local_794;
  int local_790;
  int local_78c;
  int local_788 [7];
  int local_76c;
  int local_768;
  int local_764;
  int local_760;
  int local_75c;
  int local_758 [10];
  int local_730;
  int local_72c;
  long local_728;
  long local_720;
  long local_718;
  Integer local_710;
  long local_708;
  long local_700;
  long local_6f8;
  long local_6f0;
  long local_6e8;
  long local_6e0;
  Integer local_6d8;
  long local_6d0;
  long local_6c8;
  long local_6c0;
  long local_6b8 [8];
  long local_678 [8];
  long local_638;
  long local_630;
  long local_628;
  long local_620;
  char local_618 [168];
  Integer *in_stack_fffffffffffffa90;
  Integer *in_stack_fffffffffffffa98;
  Integer *in_stack_fffffffffffffaa0;
  Integer *in_stack_fffffffffffffaa8;
  Integer *in_stack_fffffffffffffab0;
  Integer in_stack_fffffffffffffab8;
  int local_508;
  int local_504;
  int local_4c8 [8];
  int local_4a8 [8];
  int local_488 [7];
  int local_46c;
  long local_468 [8];
  long local_428 [8];
  long alStack_3e8 [8];
  long alStack_3a8 [8];
  long local_368 [8];
  long local_328 [8];
  long local_2e8 [8];
  long local_2a8 [8];
  long alStack_268 [8];
  long alStack_228 [8];
  long alStack_1e8 [8];
  long local_1a8 [8];
  long local_168 [7];
  long local_130;
  C_Integer aCStack_128 [8];
  C_Integer aCStack_e8 [8];
  long alStack_a8 [8];
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  Integer local_8;
  
  local_38 = in_RDI + 1000;
  local_130 = 0;
  bVar3 = true;
  local_8 = in_RDI;
  IVar6 = pnga_nodeid();
  lVar7 = pnga_has_ghosts(local_8);
  if (lVar7 != 0) {
    __ptr = malloc((GAnproc * 0xe + 1) * 8);
    if (__ptr == (void *)0x0) {
      pnga_error((char *)CONCAT44(in_stack_fffffffffffff444,in_stack_fffffffffffff440),
                 in_stack_fffffffffffff438);
    }
    __ptr_00 = malloc(GAnproc << 3);
    if (__ptr_00 == (void *)0x0) {
      pnga_error((char *)CONCAT44(in_stack_fffffffffffff444,in_stack_fffffffffffff440),
                 in_stack_fffffffffffff438);
    }
    local_48 = (long)GA[local_38].elemsize;
    local_50 = (long)GA[local_38].ndim;
    local_46c = GA[local_38].corner_flag;
    lVar8 = (long)GA[local_38].p_handle;
    pnga_distribution(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0,
                      in_stack_fffffffffffff5a8);
    for (local_10 = 0; local_10 < local_50; local_10 = local_10 + 1) {
      alStack_a8[local_10] = 0;
      aCStack_e8[local_10] = GA[local_38].width[local_10];
      aCStack_128[local_10] = GA[local_38].dims[local_10];
      if ((local_168[local_10] == 0) && (local_1a8[local_10] == -1)) {
        bVar3 = false;
      }
    }
    for (local_10 = 0; local_10 < local_50; local_10 = local_10 + 1) {
      local_58 = aCStack_e8[local_10];
      if ((aCStack_e8[local_10] != 0) && (bVar3)) {
        for (local_28 = 0; local_28 < local_50; local_28 = local_28 + 1) {
          if (local_28 == local_10) {
            alStack_228[local_28] = local_168[local_28] - local_58;
            alStack_268[local_28] = local_168[local_28] + -1;
            if (alStack_228[local_28] < 1) {
              if (alStack_268[local_28] < 1) {
                local_130 = 1;
              }
              else {
                local_130 = 2;
              }
            }
            else {
              local_130 = 1;
            }
          }
          else {
            alStack_228[local_28] = local_168[local_28];
            alStack_268[local_28] = local_1a8[local_28];
          }
        }
        for (local_20 = 0; iVar4 = (int)IVar6, local_20 < local_130; local_20 = local_20 + 1) {
          for (local_28 = 0; local_28 < local_50; local_28 = local_28 + 1) {
            if ((local_130 == 2) && (local_28 == local_10)) {
              if (local_20 == 0) {
                local_328[local_28] = 1;
                local_368[local_28] = alStack_268[local_28];
              }
              else {
                local_328[local_28] = alStack_228[local_28] + aCStack_128[local_28];
                local_368[local_28] = aCStack_128[local_28];
              }
            }
            else if (local_28 == local_10) {
              if (alStack_228[local_28] < 1) {
                local_328[local_28] = (aCStack_128[local_28] - local_58) + 1;
                local_368[local_28] = aCStack_128[local_28];
              }
              else {
                local_328[local_28] = alStack_228[local_28];
                local_368[local_28] = alStack_268[local_28];
              }
            }
            else {
              local_328[local_28] = alStack_228[local_28];
              local_368[local_28] = alStack_268[local_28];
            }
          }
          lVar7 = pnga_locate_region(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                                     in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                                     in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
          if (lVar7 == 0) {
            sprintf(local_618,"%s","cannot locate region: ");
            sVar9 = strlen("cannot locate region: ");
            sprintf(local_618 + (int)sVar9,"%s",GA[local_8 + 1000].name);
            sVar9 = strlen(local_618);
            sprintf(local_618 + (int)sVar9," [%ld:%ld ",local_328[0],local_368[0]);
            sVar9 = strlen(local_618);
            local_508 = (int)sVar9;
            local_504 = 1;
            while( true ) {
              in_stack_fffffffffffff2b0 = (void *)(long)local_504;
              IVar10 = pnga_ndim(in_stack_fffffffffffff490);
              if (IVar10 <= (long)in_stack_fffffffffffff2b0) break;
              sprintf(local_618 + local_508,",%ld:%ld ",local_328[local_504],local_368[local_504]);
              sVar9 = strlen(local_618);
              local_508 = (int)sVar9;
              local_504 = local_504 + 1;
            }
            sprintf(local_618 + local_508,"%s","]");
            strlen(local_618);
            pnga_error((char *)CONCAT44(in_stack_fffffffffffff444,in_stack_fffffffffffff440),
                       in_stack_fffffffffffff438);
          }
          for (local_18 = 0; local_18 < local_30; local_18 = local_18 + 1) {
            local_40 = *(long *)((long)__ptr_00 + local_18 * 8);
            pnga_distribution(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                              in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
            for (local_28 = 0; local_28 < local_50; local_28 = local_28 + 1) {
              if (alStack_a8[local_28] == 0) {
                if (local_28 == local_10) {
                  if ((local_30 == 1) && (local_130 == 1)) {
                    alStack_3a8[local_28] = (local_2e8[local_28] - local_2a8[local_28]) + 1;
                    alStack_3e8[local_28] =
                         (local_2e8[local_28] - local_2a8[local_28]) + aCStack_e8[local_28];
                    alStack_1e8[local_28] = 0;
                  }
                  else {
                    if (local_2a8[local_28] < local_328[local_28]) {
                      local_60 = 0;
                      local_68 = local_2e8[local_28] - local_328[local_28];
                    }
                    else {
                      local_60 = local_2a8[local_28] - alStack_228[local_28];
                      local_68 = local_2e8[local_28] - local_2a8[local_28];
                    }
                    if (local_60 < 0) {
                      local_60 = local_60 + aCStack_128[local_28];
                    }
                    if (aCStack_128[local_28] <= local_60) {
                      local_60 = local_60 - aCStack_128[local_28];
                    }
                    alStack_3a8[local_28] =
                         ((local_2e8[local_28] - local_2a8[local_28]) + aCStack_e8[local_28]) -
                         local_68;
                    alStack_3e8[local_28] =
                         (local_2e8[local_28] - local_2a8[local_28]) + aCStack_e8[local_28];
                    alStack_1e8[local_28] = local_60;
                  }
                }
                else {
                  alStack_3a8[local_28] = aCStack_e8[local_28];
                  alStack_3e8[local_28] =
                       (local_2e8[local_28] - local_2a8[local_28]) + aCStack_e8[local_28];
                  alStack_1e8[local_28] = aCStack_e8[local_28];
                }
              }
              else {
                alStack_3a8[local_28] = 0;
                alStack_3e8[local_28] =
                     (local_2e8[local_28] - local_2a8[local_28]) + alStack_a8[local_28];
                alStack_1e8[local_28] = 0;
              }
            }
            local_628 = 1;
            local_630 = (long)(GA[local_38].ndim + -1);
            local_638 = 0;
            if (GA[local_38].distr_type == 0) {
              if (GA[local_38].num_rstrctd == 0) {
                local_6e0 = (long)GA[local_38].ndim;
                local_6e8 = 0;
                local_6c8 = 1;
                for (local_6d0 = 0; local_6d0 < local_6e0; local_6d0 = local_6d0 + 1) {
                  local_6c8 = GA[local_38].nblock[local_6d0] * local_6c8;
                }
                if ((local_6c8 + -1 < IVar6) || (IVar6 < 0)) {
                  for (local_6d0 = 0; local_6d0 < local_6e0; local_6d0 = local_6d0 + 1) {
                    local_678[local_6d0] = 0;
                    local_6b8[local_6d0] = -1;
                  }
                }
                else {
                  local_6d8 = IVar6;
                  for (local_6d0 = 0; local_6d0 < local_6e0; local_6d0 = local_6d0 + 1) {
                    local_6c0 = local_6d8 % (long)GA[local_38].nblock[local_6d0];
                    local_6d8 = local_6d8 / (long)GA[local_38].nblock[local_6d0];
                    local_6f0 = local_6c0 + local_6e8;
                    local_6e8 = GA[local_38].nblock[local_6d0] + local_6e8;
                    local_678[local_6d0] = GA[local_38].mapc[local_6f0];
                    if (local_6c0 == GA[local_38].nblock[local_6d0] + -1) {
                      local_6b8[local_6d0] = GA[local_38].dims[local_6d0];
                    }
                    else {
                      local_6b8[local_6d0] = GA[local_38].mapc[local_6f0 + 1] + -1;
                    }
                  }
                }
              }
              else if (IVar6 < GA[local_38].num_rstrctd) {
                local_718 = (long)GA[local_38].ndim;
                local_720 = 0;
                local_700 = 1;
                for (local_708 = 0; local_708 < local_718; local_708 = local_708 + 1) {
                  local_700 = GA[local_38].nblock[local_708] * local_700;
                }
                if ((local_700 + -1 < IVar6) || (IVar6 < 0)) {
                  for (local_708 = 0; local_708 < local_718; local_708 = local_708 + 1) {
                    local_678[local_708] = 0;
                    local_6b8[local_708] = -1;
                  }
                }
                else {
                  local_710 = IVar6;
                  for (local_708 = 0; local_708 < local_718; local_708 = local_708 + 1) {
                    local_6f8 = local_710 % (long)GA[local_38].nblock[local_708];
                    local_710 = local_710 / (long)GA[local_38].nblock[local_708];
                    local_728 = local_6f8 + local_720;
                    local_720 = GA[local_38].nblock[local_708] + local_720;
                    local_678[local_708] = GA[local_38].mapc[local_728];
                    if (local_6f8 == GA[local_38].nblock[local_708] + -1) {
                      local_6b8[local_708] = GA[local_38].dims[local_708];
                    }
                    else {
                      local_6b8[local_708] = GA[local_38].mapc[local_728 + 1] + -1;
                    }
                  }
                }
              }
              else {
                sVar1 = GA[local_38].ndim;
                local_730 = (int)sVar1;
                for (local_72c = 0; local_72c < sVar1; local_72c = local_72c + 1) {
                  local_678[local_72c] = 0;
                  local_6b8[local_72c] = -1;
                }
              }
            }
            else if (((GA[local_38].distr_type == 1) || (GA[local_38].distr_type == 2)) ||
                    (GA[local_38].distr_type == 3)) {
              sVar1 = GA[local_38].ndim;
              local_760 = (int)sVar1;
              sVar2 = GA[local_38].ndim;
              local_76c = (int)sVar2;
              local_764 = iVar4;
              local_758[0] = (int)((long)iVar4 % GA[local_38].num_blocks[0]);
              for (local_768 = 1; local_768 < sVar2; local_768 = local_768 + 1) {
                local_764 = (int)((long)(local_764 - local_758[local_768 + -1]) /
                                 GA[local_38].num_blocks[local_768 + -1]);
                local_758[local_768] = (int)((long)local_764 % GA[local_38].num_blocks[local_768]);
              }
              for (local_75c = 0; local_75c < sVar1; local_75c = local_75c + 1) {
                local_678[local_75c] =
                     (long)local_758[local_75c] * GA[local_38].block_dims[local_75c] + 1;
                local_6b8[local_75c] =
                     (long)(local_758[local_75c] + 1) * GA[local_38].block_dims[local_75c];
                if (GA[local_38].dims[local_75c] < local_6b8[local_75c]) {
                  local_6b8[local_75c] = GA[local_38].dims[local_75c];
                }
              }
            }
            else if (GA[local_38].distr_type == 4) {
              sVar1 = GA[local_38].ndim;
              local_790 = (int)sVar1;
              local_794 = 0;
              sVar2 = GA[local_38].ndim;
              local_7a0 = (int)sVar2;
              local_798 = iVar4;
              local_788[0] = (int)((long)iVar4 % GA[local_38].num_blocks[0]);
              for (local_79c = 1; local_79c < sVar2; local_79c = local_79c + 1) {
                local_798 = (int)((long)(local_798 - local_788[local_79c + -1]) /
                                 GA[local_38].num_blocks[local_79c + -1]);
                local_788[local_79c] = (int)((long)local_798 % GA[local_38].num_blocks[local_79c]);
              }
              for (local_78c = 0; local_78c < sVar1; local_78c = local_78c + 1) {
                local_678[local_78c] = GA[local_38].mapc[local_794 + local_788[local_78c]];
                if ((long)local_788[local_78c] < GA[local_38].num_blocks[local_78c] + -1) {
                  local_6b8[local_78c] =
                       GA[local_38].mapc[local_794 + local_788[local_78c] + 1] + -1;
                }
                else {
                  local_6b8[local_78c] = GA[local_38].dims[local_78c];
                }
                local_794 = local_794 + (int)GA[local_38].num_blocks[local_78c];
              }
            }
            if (local_630 == 0) {
              local_428[0] = (local_6b8[0] - local_678[0]) + 1 + GA[local_38].width[0] * 2;
            }
            for (local_620 = 0; local_620 < local_630; local_620 = local_620 + 1) {
              local_638 = alStack_1e8[local_620] * local_628 + local_638;
              local_428[local_620] =
                   (local_6b8[local_620] - local_678[local_620]) + 1 +
                   GA[local_38].width[local_620] * 2;
              local_628 = local_428[local_620] * local_628;
            }
            local_638 = alStack_1e8[local_630] * local_628 + local_638;
            local_7b0 = 1;
            local_7b8 = (long)(GA[local_38].ndim + -1);
            local_7c0 = 0;
            if (GA[local_38].distr_type == 0) {
              if (GA[local_38].num_rstrctd == 0) {
                local_860 = (long)GA[local_38].ndim;
                local_868 = 0;
                local_848 = 1;
                for (local_850 = 0; local_850 < local_860; local_850 = local_850 + 1) {
                  local_848 = GA[local_38].nblock[local_850] * local_848;
                }
                if ((local_848 + -1 < local_40) || (local_40 < 0)) {
                  for (local_850 = 0; local_850 < local_860; local_850 = local_850 + 1) {
                    local_7f8[local_850] = 0;
                    local_838[local_850] = -1;
                  }
                }
                else {
                  local_858 = local_40;
                  for (local_850 = 0; local_850 < local_860; local_850 = local_850 + 1) {
                    local_840 = local_858 % (long)GA[local_38].nblock[local_850];
                    local_858 = local_858 / (long)GA[local_38].nblock[local_850];
                    local_870 = local_840 + local_868;
                    local_868 = GA[local_38].nblock[local_850] + local_868;
                    local_7f8[local_850] = GA[local_38].mapc[local_870];
                    if (local_840 == GA[local_38].nblock[local_850] + -1) {
                      local_838[local_850] = GA[local_38].dims[local_850];
                    }
                    else {
                      local_838[local_850] = GA[local_38].mapc[local_870 + 1] + -1;
                    }
                  }
                }
              }
              else if (local_40 < GA[local_38].num_rstrctd) {
                local_898 = (long)GA[local_38].ndim;
                local_8a0 = 0;
                local_880 = 1;
                for (local_888 = 0; local_888 < local_898; local_888 = local_888 + 1) {
                  local_880 = GA[local_38].nblock[local_888] * local_880;
                }
                if ((local_880 + -1 < local_40) || (local_40 < 0)) {
                  for (local_888 = 0; local_888 < local_898; local_888 = local_888 + 1) {
                    local_7f8[local_888] = 0;
                    local_838[local_888] = -1;
                  }
                }
                else {
                  local_890 = local_40;
                  for (local_888 = 0; local_888 < local_898; local_888 = local_888 + 1) {
                    local_878 = local_890 % (long)GA[local_38].nblock[local_888];
                    local_890 = local_890 / (long)GA[local_38].nblock[local_888];
                    local_8a8 = local_878 + local_8a0;
                    local_8a0 = GA[local_38].nblock[local_888] + local_8a0;
                    local_7f8[local_888] = GA[local_38].mapc[local_8a8];
                    if (local_878 == GA[local_38].nblock[local_888] + -1) {
                      local_838[local_888] = GA[local_38].dims[local_888];
                    }
                    else {
                      local_838[local_888] = GA[local_38].mapc[local_8a8 + 1] + -1;
                    }
                  }
                }
              }
              else {
                sVar1 = GA[local_38].ndim;
                local_8b0 = (int)sVar1;
                for (local_8ac = 0; local_8ac < sVar1; local_8ac = local_8ac + 1) {
                  local_7f8[local_8ac] = 0;
                  local_838[local_8ac] = -1;
                }
              }
            }
            else {
              iVar5 = (int)local_40;
              if (((GA[local_38].distr_type == 1) || (GA[local_38].distr_type == 2)) ||
                 (GA[local_38].distr_type == 3)) {
                sVar1 = GA[local_38].ndim;
                local_8e0 = (int)sVar1;
                sVar2 = GA[local_38].ndim;
                local_8ec = (int)sVar2;
                local_8e4 = iVar5;
                local_8d8[0] = (int)((long)iVar5 % GA[local_38].num_blocks[0]);
                for (local_8e8 = 1; local_8e8 < sVar2; local_8e8 = local_8e8 + 1) {
                  local_8e4 = (int)((long)(local_8e4 - local_8d8[local_8e8 + -1]) /
                                   GA[local_38].num_blocks[local_8e8 + -1]);
                  local_8d8[local_8e8] = (int)((long)local_8e4 % GA[local_38].num_blocks[local_8e8])
                  ;
                }
                for (local_8dc = 0; local_8dc < sVar1; local_8dc = local_8dc + 1) {
                  local_7f8[local_8dc] =
                       (long)local_8d8[local_8dc] * GA[local_38].block_dims[local_8dc] + 1;
                  local_838[local_8dc] =
                       (long)(local_8d8[local_8dc] + 1) * GA[local_38].block_dims[local_8dc];
                  if (GA[local_38].dims[local_8dc] < local_838[local_8dc]) {
                    local_838[local_8dc] = GA[local_38].dims[local_8dc];
                  }
                }
              }
              else if (GA[local_38].distr_type == 4) {
                sVar1 = GA[local_38].ndim;
                local_910 = (int)sVar1;
                local_914 = 0;
                sVar2 = GA[local_38].ndim;
                local_920 = (int)sVar2;
                local_918 = iVar5;
                local_908[0] = (int)((long)iVar5 % GA[local_38].num_blocks[0]);
                for (local_91c = 1; local_91c < sVar2; local_91c = local_91c + 1) {
                  local_918 = (int)((long)(local_918 - local_908[local_91c + -1]) /
                                   GA[local_38].num_blocks[local_91c + -1]);
                  local_908[local_91c] = (int)((long)local_918 % GA[local_38].num_blocks[local_91c])
                  ;
                }
                for (local_90c = 0; local_90c < sVar1; local_90c = local_90c + 1) {
                  local_7f8[local_90c] = GA[local_38].mapc[local_914 + local_908[local_90c]];
                  if ((long)local_908[local_90c] < GA[local_38].num_blocks[local_90c] + -1) {
                    local_838[local_90c] =
                         GA[local_38].mapc[local_914 + local_908[local_90c] + 1] + -1;
                  }
                  else {
                    local_838[local_90c] = GA[local_38].dims[local_90c];
                  }
                  local_914 = local_914 + (int)GA[local_38].num_blocks[local_90c];
                }
              }
            }
            if (local_7b8 == 0) {
              local_468[0] = (local_838[0] - local_7f8[0]) + 1 + GA[local_38].width[0] * 2;
            }
            for (local_7a8 = 0; local_7a8 < local_7b8; local_7a8 = local_7a8 + 1) {
              local_7c0 = alStack_3a8[local_7a8] * local_7b0 + local_7c0;
              local_468[local_7a8] =
                   (local_838[local_7a8] - local_7f8[local_7a8]) + 1 +
                   GA[local_38].width[local_7a8] * 2;
              local_7b0 = local_468[local_7a8] * local_7b0;
            }
            local_7c0 = alStack_3a8[local_7b8] * local_7b0 + local_7c0;
            local_488[0] = (int)local_48;
            local_4a8[0] = (int)local_48;
            for (local_924 = 0; (long)local_924 < local_50 + -1; local_924 = local_924 + 1) {
              local_4a8[local_924] = (int)local_468[local_924] * local_4a8[local_924];
              local_488[local_924] = (int)local_428[local_924] * local_488[local_924];
              local_4a8[local_924 + 1] = local_4a8[local_924];
              local_488[local_924 + 1] = local_488[local_924];
            }
            for (local_928 = 0; local_928 < local_50; local_928 = local_928 + 1) {
              local_4c8[local_928] = ((int)alStack_3e8[local_928] - (int)alStack_3a8[local_928]) + 1
              ;
            }
            local_4c8[0] = local_4c8[0] * (int)local_48;
            if (-1 < lVar8) {
              local_40 = (long)PGRP_LIST[lVar8].inv_map_proc_list[local_40];
            }
            ARMCI_GetS((void *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                       (int *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8),
                       in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0
                       ,in_stack_fffffffffffff29c,in_stack_fffffffffffff2d0);
          }
        }
        for (local_28 = 0; local_28 < local_50; local_28 = local_28 + 1) {
          if (local_28 == local_10) {
            alStack_228[local_28] = local_1a8[local_28] + 1;
            alStack_268[local_28] = local_1a8[local_28] + local_58;
            if (aCStack_128[local_28] < alStack_268[local_28]) {
              if (aCStack_128[local_28] < alStack_228[local_28]) {
                local_130 = 1;
              }
              else {
                local_130 = 2;
              }
            }
            else {
              local_130 = 1;
            }
          }
          else {
            alStack_228[local_28] = local_168[local_28];
            alStack_268[local_28] = local_1a8[local_28];
          }
        }
        for (local_20 = 0; local_20 < local_130; local_20 = local_20 + 1) {
          for (local_28 = 0; local_28 < local_50; local_28 = local_28 + 1) {
            if ((local_130 == 2) && (local_28 == local_10)) {
              if (local_20 == 0) {
                local_328[local_28] = alStack_228[local_28];
                local_368[local_28] = aCStack_128[local_28];
              }
              else {
                local_328[local_28] = 1;
                local_368[local_28] = alStack_268[local_28] - aCStack_128[local_28];
              }
            }
            else if (local_28 == local_10) {
              if (aCStack_128[local_28] < alStack_268[local_28]) {
                local_328[local_28] = 1;
                local_368[local_28] = local_58;
              }
              else {
                local_328[local_28] = alStack_228[local_28];
                local_368[local_28] = alStack_268[local_28];
              }
            }
            else {
              local_328[local_28] = alStack_228[local_28];
              local_368[local_28] = alStack_268[local_28];
            }
          }
          lVar7 = pnga_locate_region(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                                     in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                                     in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
          if (lVar7 == 0) {
            local_938 = "cannot locate region: ";
            sprintf(local_a38,"%s","cannot locate region: ");
            local_92c = 0;
            sVar9 = strlen(local_938);
            local_930 = (int)sVar9;
            sprintf(local_a38 + local_930,"%s",GA[local_8 + 1000].name);
            sVar9 = strlen(local_a38);
            local_930 = (int)sVar9;
            sprintf(local_a38 + (int)sVar9," [%ld:%ld ",local_328[local_92c],local_368[local_92c]);
            sVar9 = strlen(local_a38);
            local_930 = (int)sVar9;
            local_92c = 1;
            while( true ) {
              in_stack_fffffffffffff2a8 = (int *)(long)local_92c;
              IVar10 = pnga_ndim(in_stack_fffffffffffff490);
              if (IVar10 <= (long)in_stack_fffffffffffff2a8) break;
              sprintf(local_a38 + local_930,",%ld:%ld ",local_328[local_92c],local_368[local_92c]);
              sVar9 = strlen(local_a38);
              local_930 = (int)sVar9;
              local_92c = local_92c + 1;
            }
            sprintf(local_a38 + local_930,"%s","]");
            sVar9 = strlen(local_a38);
            local_930 = (int)sVar9;
            pnga_error((char *)CONCAT44(in_stack_fffffffffffff444,in_stack_fffffffffffff440),
                       in_stack_fffffffffffff438);
          }
          for (local_18 = 0; local_18 < local_30; local_18 = local_18 + 1) {
            local_40 = *(long *)((long)__ptr_00 + local_18 * 8);
            pnga_distribution(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8,
                              in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
            for (local_28 = 0; local_28 < local_50; local_28 = local_28 + 1) {
              if (alStack_a8[local_28] == 0) {
                if (local_28 == local_10) {
                  if ((local_30 == 1) && (local_130 == 1)) {
                    alStack_3a8[local_28] = aCStack_e8[local_28];
                    alStack_3e8[local_28] = aCStack_e8[local_28] * 2 + -1;
                    alStack_1e8[local_28] =
                         (local_1a8[local_28] - local_168[local_28]) + 1 + aCStack_e8[local_28];
                  }
                  else {
                    local_60 = (local_2a8[local_28] - local_1a8[local_28]) + -1;
                    if (local_368[local_28] < local_2e8[local_28]) {
                      local_68 = local_368[local_28] - local_2a8[local_28];
                    }
                    else {
                      local_68 = local_2e8[local_28] - local_2a8[local_28];
                    }
                    if (local_60 < 0) {
                      local_60 = local_60 + aCStack_128[local_28];
                    }
                    if (aCStack_128[local_28] <= local_60) {
                      local_60 = local_60 - aCStack_128[local_28];
                    }
                    alStack_3a8[local_28] = aCStack_e8[local_28];
                    alStack_3e8[local_28] = aCStack_e8[local_28] + local_68;
                    alStack_1e8[local_28] =
                         (local_1a8[local_28] - local_168[local_28]) + aCStack_e8[local_28] + 1 +
                         local_60;
                  }
                }
                else {
                  alStack_3a8[local_28] = aCStack_e8[local_28];
                  alStack_3e8[local_28] =
                       (local_2e8[local_28] - local_2a8[local_28]) + aCStack_e8[local_28];
                  alStack_1e8[local_28] = aCStack_e8[local_28];
                }
              }
              else {
                alStack_3a8[local_28] = 0;
                alStack_3e8[local_28] =
                     (local_2e8[local_28] - local_2a8[local_28]) + alStack_a8[local_28];
                alStack_1e8[local_28] = 0;
              }
            }
            in_stack_fffffffffffff5b8 = 1;
            in_stack_fffffffffffff5b0 = (Integer *)(long)(GA[local_38].ndim + -1);
            lVar14 = 0;
            if (GA[local_38].distr_type == 0) {
              if (GA[local_38].num_rstrctd == 0) {
                lVar11 = (long)GA[local_38].ndim;
                local_b08 = 0;
                local_ae8 = 1;
                for (local_af0 = 0; local_af0 < lVar11; local_af0 = local_af0 + 1) {
                  local_ae8 = GA[local_38].nblock[local_af0] * local_ae8;
                }
                if ((local_ae8 + -1 < IVar6) || (IVar6 < 0)) {
                  for (local_af0 = 0; local_af0 < lVar11; local_af0 = local_af0 + 1) {
                    local_a98[local_af0] = 0;
                    local_ad8[local_af0] = -1;
                  }
                }
                else {
                  local_af8 = IVar6;
                  for (local_af0 = 0; local_af0 < lVar11; local_af0 = local_af0 + 1) {
                    lVar13 = local_af8 % (long)GA[local_38].nblock[local_af0];
                    local_af8 = local_af8 / (long)GA[local_38].nblock[local_af0];
                    lVar12 = lVar13 + local_b08;
                    local_b08 = GA[local_38].nblock[local_af0] + local_b08;
                    local_a98[local_af0] = GA[local_38].mapc[lVar12];
                    if (lVar13 == GA[local_38].nblock[local_af0] + -1) {
                      local_ad8[local_af0] = GA[local_38].dims[local_af0];
                    }
                    else {
                      local_ad8[local_af0] = GA[local_38].mapc[lVar12 + 1] + -1;
                    }
                  }
                }
              }
              else if (IVar6 < GA[local_38].num_rstrctd) {
                lVar11 = (long)GA[local_38].ndim;
                local_b40 = 0;
                local_b20 = 1;
                for (local_b28 = 0; local_b28 < lVar11; local_b28 = local_b28 + 1) {
                  local_b20 = GA[local_38].nblock[local_b28] * local_b20;
                }
                if ((local_b20 + -1 < IVar6) || (IVar6 < 0)) {
                  for (local_b28 = 0; local_b28 < lVar11; local_b28 = local_b28 + 1) {
                    local_a98[local_b28] = 0;
                    local_ad8[local_b28] = -1;
                  }
                }
                else {
                  local_b30 = IVar6;
                  for (local_b28 = 0; local_b28 < lVar11; local_b28 = local_b28 + 1) {
                    lVar13 = local_b30 % (long)GA[local_38].nblock[local_b28];
                    local_b30 = local_b30 / (long)GA[local_38].nblock[local_b28];
                    lVar12 = lVar13 + local_b40;
                    local_b40 = GA[local_38].nblock[local_b28] + local_b40;
                    local_a98[local_b28] = GA[local_38].mapc[lVar12];
                    if (lVar13 == GA[local_38].nblock[local_b28] + -1) {
                      local_ad8[local_b28] = GA[local_38].dims[local_b28];
                    }
                    else {
                      local_ad8[local_b28] = GA[local_38].mapc[lVar12 + 1] + -1;
                    }
                  }
                }
              }
              else {
                sVar1 = GA[local_38].ndim;
                for (local_b4c = 0; local_b4c < sVar1; local_b4c = local_b4c + 1) {
                  local_a98[local_b4c] = 0;
                  local_ad8[local_b4c] = -1;
                }
              }
            }
            else if (((GA[local_38].distr_type == 1) || (GA[local_38].distr_type == 2)) ||
                    (GA[local_38].distr_type == 3)) {
              sVar1 = GA[local_38].ndim;
              local_b80 = (int)sVar1;
              sVar2 = GA[local_38].ndim;
              local_b8c = (int)sVar2;
              local_b84 = iVar4;
              local_b78[0] = (int)((long)iVar4 % GA[local_38].num_blocks[0]);
              for (local_b88 = 1; local_b88 < sVar2; local_b88 = local_b88 + 1) {
                local_b84 = (int)((long)(local_b84 - local_b78[local_b88 + -1]) /
                                 GA[local_38].num_blocks[local_b88 + -1]);
                local_b78[local_b88] = (int)((long)local_b84 % GA[local_38].num_blocks[local_b88]);
              }
              for (local_b7c = 0; local_b7c < sVar1; local_b7c = local_b7c + 1) {
                local_a98[local_b7c] =
                     (long)local_b78[local_b7c] * GA[local_38].block_dims[local_b7c] + 1;
                local_ad8[local_b7c] =
                     (long)(local_b78[local_b7c] + 1) * GA[local_38].block_dims[local_b7c];
                if (GA[local_38].dims[local_b7c] < local_ad8[local_b7c]) {
                  local_ad8[local_b7c] = GA[local_38].dims[local_b7c];
                }
              }
            }
            else if (GA[local_38].distr_type == 4) {
              sVar1 = GA[local_38].ndim;
              local_bb4 = 0;
              in_stack_fffffffffffff440 = (int)GA[local_38].ndim;
              local_ba8[0] = (int)((long)iVar4 % GA[local_38].num_blocks[0]);
              local_bb8 = iVar4;
              for (in_stack_fffffffffffff444 = 1;
                  in_stack_fffffffffffff444 < in_stack_fffffffffffff440;
                  in_stack_fffffffffffff444 = in_stack_fffffffffffff444 + 1) {
                local_bb8 = (int)((long)(local_bb8 - local_ba8[in_stack_fffffffffffff444 + -1]) /
                                 GA[local_38].num_blocks[in_stack_fffffffffffff444 + -1]);
                local_ba8[in_stack_fffffffffffff444] =
                     (int)((long)local_bb8 % GA[local_38].num_blocks[in_stack_fffffffffffff444]);
              }
              for (local_bac = 0; local_bac < sVar1; local_bac = local_bac + 1) {
                local_a98[local_bac] = GA[local_38].mapc[local_bb4 + local_ba8[local_bac]];
                if ((long)local_ba8[local_bac] < GA[local_38].num_blocks[local_bac] + -1) {
                  local_ad8[local_bac] =
                       GA[local_38].mapc[local_bb4 + local_ba8[local_bac] + 1] + -1;
                }
                else {
                  local_ad8[local_bac] = GA[local_38].dims[local_bac];
                }
                local_bb4 = local_bb4 + (int)GA[local_38].num_blocks[local_bac];
              }
            }
            if (in_stack_fffffffffffff5b0 == (Integer *)0x0) {
              local_428[0] = (local_ad8[0] - local_a98[0]) + 1 + GA[local_38].width[0] * 2;
            }
            for (in_stack_fffffffffffff5c0 = 0;
                in_stack_fffffffffffff5c0 < (long)in_stack_fffffffffffff5b0;
                in_stack_fffffffffffff5c0 = in_stack_fffffffffffff5c0 + 1) {
              lVar14 = alStack_1e8[in_stack_fffffffffffff5c0] * in_stack_fffffffffffff5b8 + lVar14;
              local_428[in_stack_fffffffffffff5c0] =
                   (local_ad8[in_stack_fffffffffffff5c0] - local_a98[in_stack_fffffffffffff5c0]) + 1
                   + GA[local_38].width[in_stack_fffffffffffff5c0] * 2;
              in_stack_fffffffffffff5b8 =
                   local_428[in_stack_fffffffffffff5c0] * in_stack_fffffffffffff5b8;
            }
            in_stack_fffffffffffff5a8 =
                 (Integer *)
                 (alStack_1e8[(long)in_stack_fffffffffffff5b0] * in_stack_fffffffffffff5b8 + lVar14)
            ;
            local_bd0 = 1;
            local_bd8 = (long)(GA[local_38].ndim + -1);
            local_be0 = 0;
            if (GA[local_38].distr_type == 0) {
              if (GA[local_38].num_rstrctd == 0) {
                local_c80 = (long)GA[local_38].ndim;
                local_c88 = 0;
                local_c68 = 1;
                for (local_c70 = 0; local_c70 < local_c80; local_c70 = local_c70 + 1) {
                  local_c68 = GA[local_38].nblock[local_c70] * local_c68;
                }
                if ((local_c68 + -1 < local_40) || (local_40 < 0)) {
                  for (local_c70 = 0; local_c70 < local_c80; local_c70 = local_c70 + 1) {
                    local_c18[local_c70] = 0;
                    local_c58[local_c70] = -1;
                  }
                }
                else {
                  local_c78 = local_40;
                  for (local_c70 = 0; local_c70 < local_c80; local_c70 = local_c70 + 1) {
                    local_c60 = local_c78 % (long)GA[local_38].nblock[local_c70];
                    local_c78 = local_c78 / (long)GA[local_38].nblock[local_c70];
                    local_c90 = local_c60 + local_c88;
                    local_c88 = GA[local_38].nblock[local_c70] + local_c88;
                    local_c18[local_c70] = GA[local_38].mapc[local_c90];
                    if (local_c60 == GA[local_38].nblock[local_c70] + -1) {
                      local_c58[local_c70] = GA[local_38].dims[local_c70];
                    }
                    else {
                      local_c58[local_c70] = GA[local_38].mapc[local_c90 + 1] + -1;
                    }
                  }
                }
              }
              else if (local_40 < GA[local_38].num_rstrctd) {
                local_cb8 = (long)GA[local_38].ndim;
                local_cc0 = 0;
                local_ca0 = 1;
                for (local_ca8 = 0; local_ca8 < local_cb8; local_ca8 = local_ca8 + 1) {
                  local_ca0 = GA[local_38].nblock[local_ca8] * local_ca0;
                }
                if ((local_ca0 + -1 < local_40) || (local_40 < 0)) {
                  for (local_ca8 = 0; local_ca8 < local_cb8; local_ca8 = local_ca8 + 1) {
                    local_c18[local_ca8] = 0;
                    local_c58[local_ca8] = -1;
                  }
                }
                else {
                  local_cb0 = local_40;
                  for (local_ca8 = 0; local_ca8 < local_cb8; local_ca8 = local_ca8 + 1) {
                    local_c98 = local_cb0 % (long)GA[local_38].nblock[local_ca8];
                    local_cb0 = local_cb0 / (long)GA[local_38].nblock[local_ca8];
                    local_cc8 = local_c98 + local_cc0;
                    local_cc0 = GA[local_38].nblock[local_ca8] + local_cc0;
                    local_c18[local_ca8] = GA[local_38].mapc[local_cc8];
                    if (local_c98 == GA[local_38].nblock[local_ca8] + -1) {
                      local_c58[local_ca8] = GA[local_38].dims[local_ca8];
                    }
                    else {
                      local_c58[local_ca8] = GA[local_38].mapc[local_cc8 + 1] + -1;
                    }
                  }
                }
              }
              else {
                sVar1 = GA[local_38].ndim;
                local_cd0 = (int)sVar1;
                for (local_ccc = 0; local_ccc < sVar1; local_ccc = local_ccc + 1) {
                  local_c18[local_ccc] = 0;
                  local_c58[local_ccc] = -1;
                }
              }
            }
            else {
              local_d38 = (int)local_40;
              if (((GA[local_38].distr_type == 1) || (GA[local_38].distr_type == 2)) ||
                 (GA[local_38].distr_type == 3)) {
                sVar1 = GA[local_38].ndim;
                local_d00 = (int)sVar1;
                sVar2 = GA[local_38].ndim;
                local_d0c = (int)sVar2;
                local_d04 = local_d38;
                local_cf8[0] = (int)((long)local_d38 % GA[local_38].num_blocks[0]);
                for (local_d08 = 1; local_d08 < sVar2; local_d08 = local_d08 + 1) {
                  local_d04 = (int)((long)(local_d04 - local_cf8[local_d08 + -1]) /
                                   GA[local_38].num_blocks[local_d08 + -1]);
                  local_cf8[local_d08] = (int)((long)local_d04 % GA[local_38].num_blocks[local_d08])
                  ;
                }
                for (local_cfc = 0; local_cfc < sVar1; local_cfc = local_cfc + 1) {
                  local_c18[local_cfc] =
                       (long)local_cf8[local_cfc] * GA[local_38].block_dims[local_cfc] + 1;
                  local_c58[local_cfc] =
                       (long)(local_cf8[local_cfc] + 1) * GA[local_38].block_dims[local_cfc];
                  if (GA[local_38].dims[local_cfc] < local_c58[local_cfc]) {
                    local_c58[local_cfc] = GA[local_38].dims[local_cfc];
                  }
                }
              }
              else if (GA[local_38].distr_type == 4) {
                in_stack_fffffffffffff2d0 = (int)GA[local_38].ndim;
                local_d34 = 0;
                in_stack_fffffffffffff2c0 = (int)GA[local_38].ndim;
                local_d28[0] = (int)((long)local_d38 % GA[local_38].num_blocks[0]);
                for (in_stack_fffffffffffff2c4 = 1;
                    in_stack_fffffffffffff2c4 < in_stack_fffffffffffff2c0;
                    in_stack_fffffffffffff2c4 = in_stack_fffffffffffff2c4 + 1) {
                  local_d38 = (int)((long)(local_d38 - local_d28[in_stack_fffffffffffff2c4 + -1]) /
                                   GA[local_38].num_blocks[in_stack_fffffffffffff2c4 + -1]);
                  local_d28[in_stack_fffffffffffff2c4] =
                       (int)((long)local_d38 % GA[local_38].num_blocks[in_stack_fffffffffffff2c4]);
                }
                for (local_d2c = 0; local_d2c < in_stack_fffffffffffff2d0; local_d2c = local_d2c + 1
                    ) {
                  local_c18[local_d2c] = GA[local_38].mapc[local_d34 + local_d28[local_d2c]];
                  if ((long)local_d28[local_d2c] < GA[local_38].num_blocks[local_d2c] + -1) {
                    local_c58[local_d2c] =
                         GA[local_38].mapc[local_d34 + local_d28[local_d2c] + 1] + -1;
                  }
                  else {
                    local_c58[local_d2c] = GA[local_38].dims[local_d2c];
                  }
                  local_d34 = local_d34 + (int)GA[local_38].num_blocks[local_d2c];
                }
              }
            }
            if (local_bd8 == 0) {
              local_468[0] = (local_c58[0] - local_c18[0]) + 1 + GA[local_38].width[0] * 2;
            }
            for (in_stack_fffffffffffff438 = 0; in_stack_fffffffffffff438 < local_bd8;
                in_stack_fffffffffffff438 = in_stack_fffffffffffff438 + 1) {
              local_be0 = alStack_3a8[in_stack_fffffffffffff438] * local_bd0 + local_be0;
              local_468[in_stack_fffffffffffff438] =
                   (local_c58[in_stack_fffffffffffff438] - local_c18[in_stack_fffffffffffff438]) + 1
                   + GA[local_38].width[in_stack_fffffffffffff438] * 2;
              local_bd0 = local_468[in_stack_fffffffffffff438] * local_bd0;
            }
            local_be0 = alStack_3a8[local_bd8] * local_bd0 + local_be0;
            local_488[0] = (int)local_48;
            local_4a8[0] = (int)local_48;
            for (in_stack_fffffffffffff2bc = 0; (long)in_stack_fffffffffffff2bc < local_50 + -1;
                in_stack_fffffffffffff2bc = in_stack_fffffffffffff2bc + 1) {
              local_4a8[in_stack_fffffffffffff2bc] =
                   (int)local_468[in_stack_fffffffffffff2bc] * local_4a8[in_stack_fffffffffffff2bc];
              local_488[in_stack_fffffffffffff2bc] =
                   (int)local_428[in_stack_fffffffffffff2bc] * local_488[in_stack_fffffffffffff2bc];
              local_4a8[in_stack_fffffffffffff2bc + 1] = local_4a8[in_stack_fffffffffffff2bc];
              local_488[in_stack_fffffffffffff2bc + 1] = local_488[in_stack_fffffffffffff2bc];
            }
            for (in_stack_fffffffffffff2b8 = 0; in_stack_fffffffffffff2b8 < local_50;
                in_stack_fffffffffffff2b8 = in_stack_fffffffffffff2b8 + 1) {
              local_4c8[in_stack_fffffffffffff2b8] =
                   ((int)alStack_3e8[in_stack_fffffffffffff2b8] -
                   (int)alStack_3a8[in_stack_fffffffffffff2b8]) + 1;
            }
            local_4c8[0] = local_4c8[0] * (int)local_48;
            if (-1 < lVar8) {
              local_40 = (long)PGRP_LIST[lVar8].inv_map_proc_list[local_40];
            }
            ARMCI_GetS((void *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0),
                       (int *)CONCAT44(in_stack_fffffffffffff2bc,in_stack_fffffffffffff2b8),
                       in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0
                       ,in_stack_fffffffffffff29c,in_stack_fffffffffffff2d0);
          }
        }
      }
      if (local_10 < local_50 + -1) {
        pnga_pgroup_sync((Integer)in_stack_fffffffffffff2a0);
      }
      if (local_46c != 0) {
        alStack_a8[local_10] = local_58 << 1;
      }
    }
    free(__ptr);
    free(__ptr_00);
  }
  return;
}

Assistant:

void pnga_update1_ghosts(Integer g_a)
{
  Integer idx, ipx, inx, i, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer size, ndim, nwidth, offset, slice, increment[MAXDIM];
  Integer width[MAXDIM];
  Integer dims[MAXDIM], imax=0;
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM]/*, phi_loc[MAXDIM]*/;
  Integer lo_rem[MAXDIM], hi_rem[MAXDIM];
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer slo_rem[MAXDIM], shi_rem[MAXDIM];
  Integer plo_rem[MAXDIM], phi_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  int corner_flag;
  int stride_loc[MAXDIM], stride_rem[MAXDIM], count[MAXDIM];
  char *ptr_loc, *ptr_rem;
  logical hasData = TRUE;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

 /* This routine makes use of the shift algorithm to update data in the
   * ghost cells bounding the local block of visible data. The shift
   * algorithm starts by updating the blocks of data along the first
   * dimension by grabbing a block of data that is width[0] deep but
   * otherwise matches the  dimensions of the data residing on the
   * calling processor. The update of the second dimension, however,
   * grabs a block that is width[1] deep in the second dimension but is
   * ldim0 + 2*width[0] in the first dimensions where ldim0 is the
   * size of the visible data along the first dimension. The remaining
   * dimensions are left the same. For the next update, the width of the
   * second dimension is also increased by 2*width[1] and so on. This
   * algorith makes use of the fact that data for the dimensions that
   * have already been updated is available on each processor and can be
   * used in the updates of subsequent dimensions. The total number of
   * separate updates is 2*ndim, an update in the negative and positive
   * directions for each dimension.
   *
   * To perform the update, this routine makes use of several copies of
   * indices marking the upper and lower limits of data. Indices
   * beginning with the character "p" are relative indices marking the
   * location of the data set relative to the origin the local patch of
   * the global array, all other indices are in absolute coordinates and
   * mark locations in the total global array. The indices used by this
   * routine are described below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rem[], hi_rem[]: The lower and upper indices of the block
   *       of data on a remote processor or processors that is needed to
   *       fill in the calling processors ghost cells. These indices are
   *       NOT corrected for wrap-around (periodic) boundary conditions
   *       so they can be negative or greater than the array dimension
   *       values held in dims[].
   *
   *       slo_rem[], shi_rem[]: Similar to lo_rem[] and hi_rem[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions. If lo_rem[] and hi_rem[] cross a global
   *        array boundary, as opposed to being entirely located on one
   *       side or the other of the array, then two sets of slo_rem[] and
   *       shi_rem[] will be created. One set will correspond to the
   *       block of data on one side of the global array boundary and the
   *       other set will correspond to the remaining block. This
   *       situation will only occur if the value of the ghost cell width
   *       is greater than the dimension of the visible global array
   *       data on a single processor.
   *
   *       thi_rem[], thi_rem[]: The lower and upper indices of the visible
   *       data on a remote processor.
   *
   *       plo_loc[], phi_loc[]: The indices of the local data patch that
   *       is going to be updated.
   *
   *       plo_rem[], phi_rem[]: The indices of the data patch on the
   *       remote processor that will be used to update the data on the
   *       calling processor. Note that the dimensions of the patches
   *       represented by plo_loc[], plo_rem[] and plo_loc[], phi_loc[]
   *       must be the same.
   *
   * For the case where the width of the ghost cells is more than the
   * width of the visible data held on a processor, special problems
   * arise. It now takes several updates to fill in one block of boundary
   * data and it is now necessary to keep track of where each of these
   * blocks of data go in the ghost cell region. To do this two extra
   * variables are needed. These are offset and slice. Slice is equal to
   * the width of the visible data along the dimension being updated
   * minus one coming from the remote processor. Offset is the amount
   * that this data must be moved inward from the lower boundary of the
   * ghost cell region. Another variable that is also used to handle
   * this case is imax. If this variable is set to 2, then this means
   * that the block of data that is needed to update the ghost cells
   * crosses a global array boundary and the block needs to be broken
   * up into two pieces. */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return;

  _ga_map = malloc((GAnproc*2*MAXDIM +1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update1_ghosts:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update1_ghosts:malloc failed (_ga_proclist)",0);

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  corner_flag = GA[handle].corner_flag;
  p_handle = GA[handle].p_handle;

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[me];
  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);
  /* initialize range increments and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
    if (lo_loc[idx] == 0 && hi_loc[idx] == -1) hasData = FALSE;
  }

  /* loop over dimensions for sequential update using shift algorithm */
  for (idx=0; idx < ndim; idx++) {
    nwidth = (Integer)width[idx];

    /* Do not bother with update if nwidth is zero or processor has
       no data */
    if (nwidth != 0 && hasData) {

      /* Perform update in negative direction. Start by getting rough
         estimate of block of needed data*/
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rem[i] = lo_loc[i] - nwidth;
          hi_rem[i] = lo_loc[i] - 1;
          /* Check to see if we will need to update ghost cells using
             one or two major patches of the global array. */
          if (lo_rem[i] < 1) {
            if (hi_rem[i] > 0) {
              imax = 2;
            } else {
              imax = 1;
            }
          } else {
            imax = 1;
          }
        } else {
          lo_rem[i] = lo_loc[i];
          hi_rem[i] = hi_loc[i];
        }
      }

      for (inx = 0; inx < imax; inx++) {
        /* Check to see if boundary is being updated in one patch or two,
           adjust lower boundary accordingly. */
        for (i=0; i<ndim; i++) {
          if (imax == 2 && i == idx) {
            if (inx == 0) {
              slo_rem[i] = 1;
              shi_rem[i] = hi_rem[i];
            } else {
              slo_rem[i] = lo_rem[i] + dims[i];
              shi_rem[i] = dims[i];
            }
          } else if (i == idx) {
            if (lo_rem[i] < 1) {
              slo_rem[i] = dims[i] - nwidth + 1;
              shi_rem[i] = dims[i];
            } else {
              slo_rem[i] = lo_rem[i];
              shi_rem[i] = hi_rem[i];
            }
          } else {
            slo_rem[i] = lo_rem[i];
            shi_rem[i] = hi_rem[i];
          }
        }
        /* locate processor with this data */
        if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
            _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
            slo_rem, shi_rem, g_a);

        for (ipx = 0; ipx < np; ipx++) {
          /* Get actual coordinates of desired chunk of remote
             data as well as the actual coordinates of the local chunk
             of data that will receive the remote data (these
             coordinates take into account the presence of ghost
             cells). Start by finding out what data is actually held by
             remote processor. */
          proc_rem = _ga_proclist[ipx];
          pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
          for (i = 0; i < ndim; i++) {
            if (increment[i] == 0) {
              if (i == idx) {
                if (np == 1 && imax == 1) {
                  plo_rem[i] = thi_rem[i] - tlo_rem[i] + 1;
                  phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
                  plo_loc[i] = 0;
                  /*phi_loc[i] = width[i] - 1;*/
                } else {
                  if (tlo_rem[i] >= slo_rem[i]) {
                    offset = tlo_rem[i] - lo_rem[i];
                    slice = thi_rem[i] - tlo_rem[i];
                  } else {
                    offset = 0;
                    slice = thi_rem[i] - slo_rem[i];
                  }
                  if (offset < 0) offset = offset + dims[i];
                  if (offset >= dims[i]) offset = offset - dims[i];
                  plo_rem[i] = thi_rem[i] - tlo_rem[i] + width[i] - slice;
                  phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
                  plo_loc[i] = offset;
                  /*phi_loc[i] = offset + slice;*/
                }
              } else {
                plo_rem[i] = width[i];
                phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
                plo_loc[i] = width[i];
                /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
              }
            } else {
              plo_rem[i] = 0;
              phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
              plo_loc[i] = 0;
              /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
            }
          }

          /* Get pointer to local data buffer and remote data
             buffer as well as lists of leading dimenstions */
          gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
          gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

          /* Evaluate strides on local and remote processors */
          gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
              stride_loc);

          /* Compute the number of elements in each dimension and store
             result in count. Scale the first element in count by the
             element size. */
          gam_ComputeCount(ndim, plo_rem, phi_rem, count);
          count[0] *= size;
 
          /* get remote data */
          if (p_handle >= 0) {
            proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
          }
          ARMCI_GetS(ptr_rem, stride_rem, ptr_loc, stride_loc, count,
              (int)(ndim - 1), (int)proc_rem);
        }
      }

      /* Perform update in positive direction. Start by getting rough
         estimate of block of needed data*/
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rem[i] = hi_loc[i] + 1;
          hi_rem[i] = hi_loc[i] + nwidth;
          /* Check to see if we will need to update ghost cells using
             one or two major patches of the global array. */
          if (hi_rem[i] > dims[i]) {
            if (lo_rem[i] <= dims[i]) {
              imax = 2;
            } else {
              imax = 1;
            }
          } else {
            imax = 1;
          }
        } else {
          lo_rem[i] = lo_loc[i];
          hi_rem[i] = hi_loc[i];
        }
      }

      for (inx = 0; inx < imax; inx++) {
        /* Check to see if boundary is being updated in one patch or two,
           adjust lower boundary accordingly. */
        for (i=0; i<ndim; i++) {
          if (imax == 2 && i == idx) {
            if (inx == 0) {
              slo_rem[i] = lo_rem[i];
              shi_rem[i] = dims[i];
            } else {
              slo_rem[i] = 1;
              shi_rem[i] = hi_rem[i] - dims[i];
            }
          } else if (i == idx) {
            if (hi_rem[i] > dims[i]) {
              slo_rem[i] = 1;
              shi_rem[i] = nwidth;
            } else {
              slo_rem[i] = lo_rem[i];
              shi_rem[i] = hi_rem[i];
            }
          } else {
            slo_rem[i] = lo_rem[i];
            shi_rem[i] = hi_rem[i];
          }
        }
        /* locate processor with this data */
        if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
            _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
            slo_rem, shi_rem, g_a);

        for (ipx = 0; ipx < np; ipx++) {
          /* Get actual coordinates of desired chunk of remote
             data as well as the actual coordinates of the local chunk
             of data that will receive the remote data (these
             coordinates take into account the presence of ghost
             cells). Start by finding out what data is actually held by
             remote processor. */
          proc_rem = _ga_proclist[ipx];
          pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
          for (i = 0; i < ndim; i++) {
            if (increment[i] == 0) {
              if (i == idx) {
                if (np == 1 && imax == 1) {
                  plo_rem[i] = width[i];
                  phi_rem[i] = 2*width[i] - 1;
                  plo_loc[i] = hi_loc[i] - lo_loc[i] + 1 + width[i];
                  /*phi_loc[i] = hi_loc[i] - lo_loc[i] + 2*width[i];*/
                } else {
                  offset = tlo_rem[i] - hi_loc[i] - 1;
                  if (thi_rem[i] <= shi_rem[i]) {
                    slice = thi_rem[i] - tlo_rem[i];
                  } else {
                    slice = shi_rem[i] - tlo_rem[i];
                  }
                  if (offset < 0) offset = offset + dims[i];
                  if (offset >= dims[i]) offset = offset - dims[i];
                  plo_rem[i] = width[i];
                  phi_rem[i] = width[i] + slice;
                  plo_loc[i] = hi_loc[i] - lo_loc[i] + width[i] + 1 + offset;
                  /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i] + 1
                    + offset + slice;*/
                }
              } else {
                plo_rem[i] = width[i];
                phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
                plo_loc[i] = width[i];
                /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
              }
            } else {
              plo_rem[i] = 0;
              phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
              plo_loc[i] = 0;
              /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
            }
          }

          /* Get pointer to local data buffer and remote data
             buffer as well as lists of leading dimenstions */
          gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
          gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

          /* Evaluate strides on local and remote processors */
          gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
              stride_loc);

          /* Compute the number of elements in each dimension and store
             result in count. Scale the first element in count by the
             element size. */
          gam_ComputeCount(ndim, plo_rem, phi_rem, count);
          count[0] *= size;
 
          /* get remote data */
          if (p_handle >= 0) {
            proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
          }
          ARMCI_GetS(ptr_rem, stride_rem, ptr_loc, stride_loc, count,
              (int)(ndim - 1), (int)proc_rem);
        }
      }
    }
    /* synchronize all processors and update increment array */
    if (idx < ndim-1) pnga_pgroup_sync(p_handle);
    if (corner_flag)
      increment[idx] = 2*nwidth;
  }

  free(_ga_map);
  free(_ga_proclist);
}